

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_left_predictor_16x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  bool bVar7;
  ushort uVar8;
  undefined4 uVar9;
  ushort uVar18;
  ushort uVar19;
  undefined1 extraout_XMM0 [14];
  ushort uVar16;
  ushort uVar20;
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 uVar15;
  byte bVar17;
  
  dc_sum_64(left);
  uVar8 = extraout_XMM0._0_2_ + 0x20;
  uVar16 = extraout_XMM0._2_2_ + 0x20;
  uVar18 = extraout_XMM0._4_2_ + 0x20;
  uVar19 = extraout_XMM0._6_2_ + 0x20;
  auVar10._0_2_ = uVar8 >> 6;
  uVar20 = uVar19 >> 6;
  uVar1 = CONCAT22((ushort)(extraout_XMM0._8_2_ + 0x20U) >> 6,uVar20);
  auVar11._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(extraout_XMM0._10_2_ + 0x20U) >> 6,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar12._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(extraout_XMM0._12_2_ + 0x20U) >> 6,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar13._0_13_ = auVar5 << 0x30;
  bVar17 = (byte)(uVar19 >> 8);
  auVar13._14_2_ = (undefined2)(CONCAT19(bVar17 >> 6,CONCAT18(bVar17 >> 6,uVar3)) >> 0x40);
  auVar13[0xd] = (char)uVar20;
  bVar17 = (byte)(uVar18 >> 0xe);
  auVar12._12_4_ = (undefined4)(CONCAT37(auVar13._13_3_,CONCAT16((char)uVar20,uVar2)) >> 0x30);
  auVar12[0xb] = bVar17;
  uVar15 = (undefined1)(uVar18 >> 6);
  auVar11._10_6_ = (undefined6)(CONCAT55(auVar12._11_5_,CONCAT14(bVar17,uVar1)) >> 0x20);
  auVar11[9] = uVar15;
  bVar17 = (byte)(uVar16 >> 0xe);
  auVar10._8_8_ = (undefined8)(CONCAT73(auVar11._9_7_,CONCAT12(uVar15,uVar20)) >> 0x10);
  auVar10[7] = bVar17;
  auVar10[6] = bVar17;
  uVar15 = (undefined1)(uVar16 >> 6);
  auVar10[5] = uVar15;
  auVar10[4] = uVar15;
  bVar17 = (byte)(uVar8 >> 8);
  auVar10[3] = bVar17 >> 6;
  auVar10[2] = bVar17 >> 6;
  auVar14[0] = (undefined1)auVar10._0_2_;
  auVar14._2_14_ = auVar10._2_14_;
  auVar14[1] = auVar14[0];
  auVar14 = pshuflw(auVar14,auVar14,0);
  uVar9 = auVar14._0_4_;
  iVar6 = 0x40;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    *(undefined4 *)dst = uVar9;
    *(undefined4 *)(dst + 4) = uVar9;
    *(undefined4 *)(dst + 8) = uVar9;
    *(undefined4 *)(dst + 0xc) = uVar9;
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_dc_left_predictor_16x64_sse2(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above,
                                      const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_64(left);
  const __m128i thirtytwo = _mm_set1_epi16(32);
  sum_left = _mm_add_epi16(sum_left, thirtytwo);
  sum_left = _mm_srai_epi16(sum_left, 6);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  sum_left = _mm_shufflelo_epi16(sum_left, 0);
  const __m128i row = _mm_unpacklo_epi64(sum_left, sum_left);
  dc_store_16xh(&row, 64, dst, stride);
}